

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelDescriptor.cpp
# Opt level: O0

string * amrex::ParallelDescriptor::mpi_level_to_string_abi_cxx11_(int mtlev)

{
  string *in_RDI;
  allocator local_15;
  undefined1 local_14 [12];
  undefined1 *local_8;
  
  local_8 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"UNKNOWN",&local_15);
  std::allocator<char>::~allocator((allocator<char> *)&local_15);
  return in_RDI;
}

Assistant:

std::string
mpi_level_to_string (int mtlev)
{
    amrex::ignore_unused(mtlev);
#ifdef AMREX_USE_MPI
    if (mtlev == MPI_THREAD_SINGLE)
        return std::string("MPI_THREAD_SINGLE");
    if (mtlev == MPI_THREAD_FUNNELED)
        return std::string("MPI_THREAD_FUNNELED");
    if (mtlev == MPI_THREAD_SERIALIZED)
        return std::string("MPI_THREAD_SERIALIZED");
    if (mtlev == MPI_THREAD_MULTIPLE)
        return std::string("MPI_THREAD_MULTIPLE");
#endif
    return std::string("UNKNOWN");
}